

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.cpp
# Opt level: O3

ostream * wasm::operator<<(ostream *o,WasmException *exn)

{
  ostream *poVar1;
  char *in_RCX;
  Name name;
  SmallVector<wasm::Literal,_1UL> local_60;
  undefined1 local_28 [8];
  shared_ptr<wasm::ExnData> exnData;
  
  Literal::getExnData((Literal *)local_28);
  name.super_IString.str._M_str = in_RCX;
  name.super_IString.str._M_len =
       (((Literals *)((long)local_28 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
  poVar1 = operator<<((wasm *)o,(ostream *)((HeapType *)local_28)->id,name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  SmallVector<wasm::Literal,_1UL>::SmallVector
            (&local_60,
             (SmallVector<wasm::Literal,_1UL> *)
             &(((Literals *)((long)local_28 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed);
  poVar1 = operator<<(poVar1,(Literals *)&local_60);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_60.flexible);
  Literal::~Literal(local_60.fixed._M_elems);
  if (exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const WasmException& exn) {
  auto exnData = exn.exn.getExnData();
  return o << exnData->tag << " " << exnData->payload;
}